

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitPow2
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,UnaryExpr e)

{
  BasicStringRef<char> value;
  char *in_RSI;
  BasicWriter<char> *in_RDI;
  size_t unaff_retaddr;
  int in_stack_00000014;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *in_stack_00000018;
  ExprBase in_stack_00000020;
  BasicWriter<char> *this_00;
  
  this_00 = in_RDI;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  ::arg((BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
         *)in_RDI);
  Visit(in_stack_00000018,(NumericExpr)in_stack_00000020.impl_,in_stack_00000014);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)in_RDI->buffer_,(char *)in_RDI);
  value.size_ = unaff_retaddr;
  value.data_ = in_RSI;
  fmt::BasicWriter<char>::operator<<(this_00,value);
  return;
}

Assistant:

void VisitPow2(UnaryExpr e) {
    Visit(e.arg(), prec::EXPONENTIATION + 1);
    writer_ << " ^ 2";
  }